

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

uintmax_t ghc::filesystem::file_size(path *p,error_code *ec)

{
  int iVar1;
  value_type *__file;
  error_code eVar2;
  undefined4 uStack_bc;
  undefined1 local_b0 [8];
  stat fileStat;
  error_code *ec_local;
  path *p_local;
  
  fileStat.__glibc_reserved[2] = (__syscall_slong_t)ec;
  std::error_code::clear(ec);
  __file = path::c_str(p);
  iVar1 = stat(__file,(stat *)local_b0);
  if (iVar1 == -1) {
    eVar2 = detail::make_system_error(0);
    *(ulong *)fileStat.__glibc_reserved[2] = CONCAT44(uStack_bc,eVar2._M_value);
    *(error_category **)(fileStat.__glibc_reserved[2] + 8) = eVar2._M_cat;
    p_local = (path *)0xffffffffffffffff;
  }
  else {
    p_local = (path *)fileStat.st_rdev;
  }
  return (uintmax_t)p_local;
}

Assistant:

GHC_INLINE uintmax_t file_size(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
        return static_cast<uintmax_t>(-1);
    }
    return static_cast<uintmax_t>(attr.nFileSizeHigh) << (sizeof(attr.nFileSizeHigh) * 8) | attr.nFileSizeLow;
#else
    struct ::stat fileStat;
    if (::stat(p.c_str(), &fileStat) == -1) {
        ec = detail::make_system_error();
        return static_cast<uintmax_t>(-1);
    }
    return static_cast<uintmax_t>(fileStat.st_size);
#endif
}